

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O1

int callback_file_skip(output_file *out,int64_t off)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  output_file_callback *outc;
  long lVar4;
  
  if (off < 1) {
    return 0;
  }
  while( true ) {
    lVar4 = 0x7fffffff;
    if (off < 0x7fffffff) {
      lVar4 = off;
    }
    iVar2 = (**(code **)&out[1].chunk_cnt)(out[1].cur_out_ptr,0,lVar4);
    if (iVar2 < 0) break;
    lVar3 = off - lVar4;
    bVar1 = off < lVar4;
    off = lVar3;
    if (lVar3 == 0 || bVar1) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

static int callback_file_skip(struct output_file* out, int64_t off) {
  struct output_file_callback* outc = to_output_file_callback(out);
  int to_write;
  int ret;

  while (off > 0) {
    to_write = std::min(off, (int64_t)INT_MAX);
    ret = outc->write(outc->priv, nullptr, to_write);
    if (ret < 0) {
      return ret;
    }
    off -= to_write;
  }

  return 0;
}